

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void icetStateDestroy(IceTState state)

{
  undefined4 local_14;
  IceTEnum pname;
  IceTState state_local;
  
  for (local_14 = 0; local_14 < 0x200; local_14 = local_14 + 1) {
    stateFree(local_14,state);
  }
  free(state);
  return;
}

Assistant:

void icetStateDestroy(IceTState state)
{
    IceTEnum pname;

    for (pname = ICET_STATE_ENGINE_START;
         pname < ICET_STATE_ENGINE_END;
         pname++) {
        stateFree(pname, state);
    }
    free(state);
}